

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O2

int Ivy_FastMapNodeFaninCompact2(Ivy_Man_t *pAig,Ivy_Obj_t *pObj,int nLimit,Vec_Ptr_t *vFront)

{
  uint uVar1;
  int iVar2;
  Ivy_Obj_t *pObj_00;
  int i;
  
  i = 0;
  while( true ) {
    if (vFront->nSize <= i) {
      return 0;
    }
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(vFront,i);
    uVar1 = *(uint *)&pObj_00->field_0x8 & 0xf;
    if (((uVar1 != 1) && (uVar1 != 4)) &&
       (iVar2 = Ivy_FastMapNodeFaninCost(pAig,pObj_00), iVar2 < 1)) break;
    i = i + 1;
  }
  Ivy_FastMapNodeFaninUpdate(pAig,pObj_00,vFront);
  return 1;
}

Assistant:

int Ivy_FastMapNodeFaninCompact2( Ivy_Man_t * pAig, Ivy_Obj_t * pObj, int nLimit, Vec_Ptr_t * vFront )
{
    Ivy_Obj_t * pFanin;
    int i;
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pFanin, i )
    {
        if ( Ivy_ObjIsCi(pFanin) )
            continue;
        if ( Ivy_FastMapNodeFaninCost(pAig, pFanin) <= 0 )
        {
            Ivy_FastMapNodeFaninUpdate( pAig, pFanin, vFront );
            return 1;
        }
    }
    return 0;
}